

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_369d94::HighbdDrPredTest_OperationCheck_Test::TestBody
          (HighbdDrPredTest_OperationCheck_Test *this)

{
  int iVar1;
  long in_RDI;
  int angle;
  int in_stack_000003f8;
  undefined1 in_stack_000003fe;
  undefined1 in_stack_000003ff;
  DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  *in_stack_00000400;
  int local_c;
  
  if (*(long *)(in_RDI + 0x50) != 0) {
    *(undefined4 *)(in_RDI + 0x18) = 0;
    while (*(int *)(in_RDI + 0x18) < 2) {
      for (local_c = *(int *)(in_RDI + 0x3c); local_c < *(int *)(in_RDI + 0x40);
          local_c = local_c + 1) {
        iVar1 = av1_get_dx(local_c);
        *(int *)(in_RDI + 0x2c) = iVar1;
        iVar1 = av1_get_dy(local_c);
        *(int *)(in_RDI + 0x30) = iVar1;
        if ((*(int *)(in_RDI + 0x2c) != 0) && (*(int *)(in_RDI + 0x30) != 0)) {
          DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
          ::RunTest(in_stack_00000400,(bool)in_stack_000003ff,(bool)in_stack_000003fe,
                    in_stack_000003f8);
        }
      }
      *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
    }
  }
  return;
}

Assistant:

TEST_P(HighbdDrPredTest, OperationCheck) {
  if (params_.tst_fn == nullptr) return;
  for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
    for (int angle = start_angle_; angle < stop_angle_; angle++) {
      dx_ = av1_get_dx(angle);
      dy_ = av1_get_dy(angle);
      if (dx_ && dy_) RunTest(false, false, angle);
    }
  }
}